

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_stream_socket.hpp
# Opt level: O2

size_t __thiscall
asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::write_some<asio::const_buffers_1>
          (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *this,const_buffers_1 *buffers)

{
  size_t sVar1;
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = detail::reactive_socket_service_base::send<asio::const_buffers_1>
                    (&((this->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                      service_)->super_reactive_socket_service_base,
                     &(this->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                      implementation_.super_base_implementation_type,buffers,0,&local_28);
  detail::throw_error(&local_28,"write_some");
  return sVar1;
}

Assistant:

std::size_t write_some(const ConstBufferSequence& buffers)
  {
    asio::error_code ec;
    std::size_t s = this->impl_.get_service().send(
        this->impl_.get_implementation(), buffers, 0, ec);
    asio::detail::throw_error(ec, "write_some");
    return s;
  }